

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O2

deBool qpTestLog_endSample(qpTestLog *log)

{
  deBool dVar1;
  
  deMutex_lock(log->lock);
  dVar1 = qpXmlWriter_endElement(log->writer,"Sample");
  if (dVar1 == 0) {
    qpPrintf("qpTestLog_endSample(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  return (uint)(dVar1 != 0);
}

Assistant:

deBool qpTestLog_endSample (qpTestLog* log)
{
	DE_ASSERT(log);
	deMutex_lock(log->lock);

	if (!qpXmlWriter_endElement(log->writer, "Sample"))
	{
		qpPrintf("qpTestLog_endSample(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		return DE_FALSE;
	}

	DE_ASSERT(ContainerStack_pop(&log->containerStack) == CONTAINERTYPE_SAMPLE);

	deMutex_unlock(log->lock);
	return DE_TRUE;
}